

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimization-options.h
# Opt level: O0

void __thiscall
wasm::OptimizationOptions::addPassArg(OptimizationOptions *this,string *key,string *value)

{
  reverse_iterator __u;
  bool bVar1;
  pointer pPVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  string *psVar3;
  ulong uVar4;
  Fatal *pFVar5;
  Fatal local_358;
  reverse_iterator<__gnu_cxx::__normal_iterator<wasm::OptimizationOptions::PassInfo_*,_std::vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>_>_>
  local_1d0 [3];
  Fatal local_1b8;
  undefined1 local_30 [16];
  reverse_iterator i;
  string *value_local;
  string *key_local;
  OptimizationOptions *this_local;
  
  i.current._M_current =
       (__normal_iterator<wasm::OptimizationOptions::PassInfo_*,_std::vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>_>
        )(__normal_iterator<wasm::OptimizationOptions::PassInfo_*,_std::vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>_>
          )value;
  std::
  vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
  ::rbegin((vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
            *)(local_30 + 8));
  while( true ) {
    std::
    vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
    ::rend((vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>
            *)local_30);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<wasm::OptimizationOptions::PassInfo_*,_std::vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>_>_>
                             *)(local_30 + 8),
                            (reverse_iterator<__gnu_cxx::__normal_iterator<wasm::OptimizationOptions::PassInfo_*,_std::vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>_>_>
                             *)local_30);
    if (!bVar1) {
      psVar3 = (string *)wasm::PassRegistry::get();
      uVar4 = wasm::PassRegistry::containsPass(psVar3);
      if ((uVar4 & 1) == 0) {
        ToolOptions::addPassArg(&this->super_ToolOptions,key,(string *)i.current._M_current);
        return;
      }
      Fatal::Fatal(&local_358);
      pFVar5 = Fatal::operator<<(&local_358,(char (*) [11])"can\'t set ");
      pFVar5 = Fatal::operator<<(pFVar5,key);
      Fatal::operator<<(pFVar5,(char (*) [19])": pass not enabled");
      Fatal::~Fatal(&local_358);
    }
    pPVar2 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<wasm::OptimizationOptions::PassInfo_*,_std::vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<wasm::OptimizationOptions::PassInfo_*,_std::vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>_>_>
                           *)(local_30 + 8));
    bVar1 = std::operator!=(&pPVar2->name,key);
    if (!bVar1) break;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<wasm::OptimizationOptions::PassInfo_*,_std::vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>_>_>
    ::operator++(local_1d0,(int)local_30 + 8);
  }
  pPVar2 = std::
           reverse_iterator<__gnu_cxx::__normal_iterator<wasm::OptimizationOptions::PassInfo_*,_std::vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>_>_>
           ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<wasm::OptimizationOptions::PassInfo_*,_std::vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>_>_>
                         *)(local_30 + 8));
  bVar1 = std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::has_value(&pPVar2->argument);
  __u = i;
  if (!bVar1) {
    pPVar2 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<wasm::OptimizationOptions::PassInfo_*,_std::vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<wasm::OptimizationOptions::PassInfo_*,_std::vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>_>_>
                           *)(local_30 + 8));
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)&pPVar2->argument,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __u.current._M_current);
    return;
  }
  Fatal::Fatal(&local_1b8);
  pPVar2 = std::
           reverse_iterator<__gnu_cxx::__normal_iterator<wasm::OptimizationOptions::PassInfo_*,_std::vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>_>_>
           ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<wasm::OptimizationOptions::PassInfo_*,_std::vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>_>_>
                         *)(local_30 + 8));
  pFVar5 = Fatal::operator<<(&local_1b8,&pPVar2->name);
  pFVar5 = Fatal::operator<<(pFVar5,(char (*) [17])" already set to ");
  pPVar2 = std::
           reverse_iterator<__gnu_cxx::__normal_iterator<wasm::OptimizationOptions::PassInfo_*,_std::vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>_>_>
           ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<wasm::OptimizationOptions::PassInfo_*,_std::vector<wasm::OptimizationOptions::PassInfo,_std::allocator<wasm::OptimizationOptions::PassInfo>_>_>_>
                         *)(local_30 + 8));
  arg = std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        operator*(&pPVar2->argument);
  Fatal::operator<<(pFVar5,arg);
  Fatal::~Fatal(&local_1b8);
}

Assistant:

void addPassArg(const std::string& key, const std::string& value) override {
    // Scan the current pass list for the last defined instance of a pass named
    // like the argument under consideration.
    for (auto i = passes.rbegin(); i != passes.rend(); i++) {
      if (i->name != key) {
        continue;
      }

      if (i->argument.has_value()) {
        Fatal() << i->name << " already set to " << *(i->argument);
      }

      // Found? Store the argument value there and return.
      i->argument = value;
      return;
    }

    // Not found? Store it globally if there is no pass with the same name.
    if (!PassRegistry::get()->containsPass(key)) {
      return ToolOptions::addPassArg(key, value);
    }

    // Not found, but we have a pass with the same name? Bail out.
    Fatal() << "can't set " << key << ": pass not enabled";
  }